

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> * __thiscall
nonius::detail::
analyse<std::chrono::duration<double,std::ratio<1l,1000000000l>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>>
          (sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
           *__return_storage_ptr__,detail *this,configuration cfg,
          environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> param_2,
          __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
          first,__normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
                last)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last_00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_R8;
  _Vector_base<double,_std::allocator<double>_> local_b8;
  _Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  local_98;
  outlier_classification local_7c;
  bootstrap_analysis local_68;
  
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (double *)0x0;
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)&local_b8,
             (long)last._M_current - (long)first._M_current >> 3);
  std::
  transform<__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>,nonius::detail::analyse<std::chrono::duration<double,std::ratio<1l,1000000000l>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>>(nonius::configuration,nonius::environment<std::chrono::duration<double,std::ratio<1l,1000000000l>>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>)::_lambda(std::chrono::duration<double,std::ratio<1l,1000000000l>>)_1_>
            (first._M_current,last._M_current,&local_b8);
  last_00._M_current = local_b8._M_impl.super__Vector_impl_data._M_finish;
  analyse_samples<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (&local_68,(detail *)(ulong)*(uint *)(this + 0x10),*(double *)(this + 8),
             (int)local_b8._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             local_b8._M_impl.super__Vector_impl_data._M_finish,in_R8);
  classify_outliers<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (&local_7c,(detail *)local_b8._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             local_b8._M_impl.super__Vector_impl_data._M_finish,last_00);
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  ::reserve((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
             *)&local_98,
            (long)local_b8._M_impl.super__Vector_impl_data._M_finish -
            (long)local_b8._M_impl.super__Vector_impl_data._M_start >> 3);
  std::
  transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::back_insert_iterator<std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>,nonius::detail::analyse<std::chrono::duration<double,std::ratio<1l,1000000000l>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>>(nonius::configuration,nonius::environment<std::chrono::duration<double,std::ratio<1l,1000000000l>>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>)::_lambda(double)_1_>
            (local_b8._M_impl.super__Vector_impl_data._M_start,
             local_b8._M_impl.super__Vector_impl_data._M_finish,&local_98);
  (__return_storage_ptr__->samples).
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_98._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->samples).
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = local_98._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->samples).
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_98._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->mean).point.__r = local_68.mean.point;
  (__return_storage_ptr__->mean).lower_bound.__r = local_68.mean.lower_bound;
  (__return_storage_ptr__->mean).upper_bound.__r = local_68.mean.upper_bound;
  (__return_storage_ptr__->mean).confidence_interval = local_68.mean.confidence_interval;
  (__return_storage_ptr__->standard_deviation).point.__r = local_68.standard_deviation.point;
  (__return_storage_ptr__->standard_deviation).lower_bound.__r =
       local_68.standard_deviation.lower_bound;
  (__return_storage_ptr__->standard_deviation).upper_bound.__r =
       local_68.standard_deviation.upper_bound;
  (__return_storage_ptr__->standard_deviation).confidence_interval =
       local_68.standard_deviation.confidence_interval;
  (__return_storage_ptr__->outliers).samples_seen = local_7c.samples_seen;
  (__return_storage_ptr__->outliers).low_severe = local_7c.low_severe;
  (__return_storage_ptr__->outliers).low_mild = local_7c.low_mild;
  (__return_storage_ptr__->outliers).high_mild = local_7c.high_mild;
  (__return_storage_ptr__->outliers).high_severe = local_7c.high_severe;
  __return_storage_ptr__->outlier_variance = local_68.outlier_variance;
  std::
  _Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  ::~_Vector_base(&local_98);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

sample_analysis<Duration> analyse(configuration cfg, environment<Duration>, Iterator first, Iterator last) {
            std::vector<double> samples;
            samples.reserve(last - first);
            std::transform(first, last, std::back_inserter(samples), [](Duration d) { return d.count(); });

            auto analysis = nonius::detail::analyse_samples(cfg.confidence_interval, cfg.resamples, samples.begin(), samples.end());
            auto outliers = nonius::detail::classify_outliers(samples.begin(), samples.end());

            auto wrap_estimate = [](estimate<double> e) {
                return estimate<Duration> {
                    Duration(e.point),
                    Duration(e.lower_bound),
                    Duration(e.upper_bound),
                    e.confidence_interval,
                };
            };
            std::vector<Duration> samples2;
            samples2.reserve(samples.size());
            std::transform(samples.begin(), samples.end(), std::back_inserter(samples2), [](double d) { return Duration(d); });
            return {
                std::move(samples2),
                wrap_estimate(analysis.mean),
                wrap_estimate(analysis.standard_deviation),
                outliers,
                analysis.outlier_variance,
            };
        }